

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_uescape(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined1 *__n;
  undefined1 *__s1;
  undefined8 uVar7;
  void *__buf;
  undefined1 *puVar8;
  char *pcVar9;
  void *__s2;
  undefined1 *puVar10;
  char *pcVar11;
  int *piVar12;
  double *pdVar13;
  long *plVar14;
  undefined8 extraout_RAX;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  undefined **ppuVar23;
  void *pvVar24;
  undefined **ppuVar25;
  int *piVar26;
  double dVar27;
  int extraout_XMM0_Db;
  uencode_test_t tests [7];
  bson_t b;
  bson_error_t error;
  code **ppcVar28;
  undefined4 uStack_355c;
  undefined8 uStack_3558;
  undefined2 uStack_3550;
  int iStack_3548;
  int iStack_3544;
  char acStack_3540 [504];
  code *pcStack_3348;
  undefined1 auStack_3338 [512];
  char *pcStack_3138;
  code *pcStack_3130;
  int iStack_3120;
  int iStack_311c;
  char acStack_3118 [504];
  long *plStack_2f20;
  double *pdStack_2f18;
  char *pcStack_2f10;
  code *pcStack_2f08;
  long lStack_2e90;
  long lStack_2e88;
  undefined1 auStack_2e80 [128];
  undefined1 auStack_2e00 [232];
  undefined1 auStack_2d18 [608];
  long *plStack_2ab8;
  code *pcStack_2ab0;
  undefined1 auStack_2aa8 [8];
  char acStack_2aa0 [16];
  char *pcStack_2a90;
  code *pcStack_2a88;
  uint uStack_2a04;
  undefined8 uStack_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 uStack_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 auStack_2938 [648];
  int *piStack_26b0;
  double *pdStack_26a8;
  undefined **ppuStack_26a0;
  int *piStack_2698;
  int *piStack_2690;
  code *pcStack_2688;
  undefined1 auStack_2680 [240];
  undefined1 auStack_2590 [648];
  code *apcStack_2308 [16];
  double dStack_2288;
  int aiStack_2280 [50];
  int iStack_21b8;
  int iStack_21b4;
  int aiStack_21b0 [160];
  int *piStack_1f30;
  double *pdStack_1f28;
  undefined **ppuStack_1f20;
  int *piStack_1f18;
  int *piStack_1f10;
  code *apcStack_1f08 [16];
  double dStack_1e88;
  int aiStack_1e80 [50];
  int iStack_1db8;
  int iStack_1db4;
  int aiStack_1db0 [160];
  undefined8 uStack_1b30;
  undefined1 *puStack_1b28;
  char *pcStack_1b20;
  char *pcStack_1b18;
  undefined **ppuStack_1b10;
  code *pcStack_1b08;
  int iStack_1b00;
  int iStack_1afc;
  char acStack_1af8 [504];
  undefined1 auStack_1900 [336];
  char *pcStack_17b0;
  undefined1 *puStack_17a8;
  undefined1 *puStack_17a0;
  void *pvStack_1798;
  void *pvStack_1790;
  code *pcStack_1788;
  undefined1 auStack_1780 [128];
  char acStack_1700 [232];
  undefined1 auStack_1618 [648];
  char *pcStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [224];
  int iStack_1220;
  int iStack_121c;
  char acStack_1218 [640];
  char *pcStack_f98;
  void *pvStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  char acStack_f00 [232];
  undefined1 auStack_e18 [648];
  char *pcStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [232];
  int iStack_a98;
  int iStack_a94;
  char acStack_a90 [640];
  char *pcStack_810;
  code *apcStack_808 [16];
  uint uStack_784;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  undefined1 *puStack_430;
  undefined1 *puStack_428;
  undefined1 *puStack_420;
  void *pvStack_418;
  void *pvStack_410;
  code *apcStack_408 [2];
  void *local_3f8;
  char *local_3f0;
  void *local_3e8;
  char *local_3e0;
  void *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined8 local_388;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  apcStack_408[0] = (code *)0x131a07;
  uVar5 = bson_bcon_magic();
  apcStack_408[0] = (code *)0x131a29;
  local_3f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_408[0] = (code *)0x131a4d;
  pvVar6 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  apcStack_408[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  apcStack_408[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  apcStack_408[0] = (code *)0x131aaf;
  uVar7 = bcon_new(0,"",uVar5,0,"",0);
  apcStack_408[0] = (code *)0x131ad1;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  apcStack_408[0] = (code *)0x131ad9;
  local_388 = bson_new();
  local_3f0 = "{ \"euro\": \"\\u20AC\"}";
  local_3e8 = local_3f8;
  local_3e0 = "{ \"crlf\": \"\\r\\n\"}";
  local_3d0 = "{ \"quote\": \"\\\"\"}";
  local_3c0 = "{ \"backslash\": \"\\\\\"}";
  local_3b0 = "{ \"\": \"\"}";
  local_3a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  local_390 = "{ \"nil\": \"\\u0000\"}";
  apcStack_408[0] = (code *)0x131b76;
  local_3d8 = pvVar6;
  local_3c8 = __n;
  local_3b8 = __s1;
  local_3a8 = uVar7;
  local_398 = uVar5;
  bson_append_utf8(local_388,"nil",0xffffffff,"",1);
  pvVar24 = (void *)0x8;
  while( true ) {
    apcStack_408[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3f8 + (long)pvVar24),
                                0xffffffffffffffff,local_2b8);
    puVar10 = local_380;
    __buf = pvVar24;
    if (cVar1 == '\0') break;
    apcStack_408[0] = (code *)0x131bb3;
    local_3f8 = (void *)bson_get_data(local_380);
    puVar10 = *(undefined1 **)((long)&local_3f0 + (long)pvVar24);
    apcStack_408[0] = (code *)0x131bc5;
    __buf = (void *)bson_get_data(puVar10);
    if (*(uint *)(puVar10 + 4) != local_37c) {
LAB_00131c3a:
      apcStack_408[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(local_380);
      apcStack_408[0] = (code *)0x131c59;
      uVar5 = bson_as_canonical_extended_json(puVar10);
      pvVar6 = local_3f8;
      uVar17 = 0xffffffff;
      if (local_37c == 0) goto LAB_00131c9e;
      uVar20 = 0;
      goto LAB_00131c84;
    }
    apcStack_408[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar10);
    apcStack_408[0] = (code *)0x131be7;
    pvVar6 = (void *)bson_get_data(local_380);
    apcStack_408[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar6,(ulong)*(uint *)(puVar10 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_408[0] = (code *)0x131c04;
    bson_destroy(local_380);
    pvVar24 = (void *)((long)pvVar24 + 0x10);
    __n = local_380;
    pvVar6 = __buf;
    if (pvVar24 == (void *)0x78) {
      lVar18 = 8;
      do {
        apcStack_408[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&local_3f0 + lVar18));
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)local_3f8 + uVar20) != *(char *)((long)__buf + uVar20)) {
      uVar17 = uVar20 & 0xffffffff;
      break;
    }
    uVar20 = uVar20 + 1;
    if (local_37c == (uint)uVar20) break;
LAB_00131c84:
    if (*(int *)(puVar10 + 4) == (int)uVar20) break;
  }
LAB_00131c9e:
  if ((int)uVar17 == -1) {
    uVar3 = local_37c;
    if (local_37c < *(uint *)(puVar10 + 4)) {
      uVar3 = *(uint *)(puVar10 + 4);
    }
    uVar17 = (ulong)(uVar3 - 1);
  }
  apcStack_408[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,__s1,uVar5);
  apcStack_408[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_408[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  local_3f8 = (void *)CONCAT44(local_3f8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_408[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_408[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_408[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)local_37c;
    apcStack_408[0] = (code *)0x131d2b;
    puVar8 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar8 != __n) goto LAB_00131d5c;
    puVar10 = (undefined1 *)(ulong)*(uint *)(puVar10 + 4);
    apcStack_408[0] = (code *)0x131d41;
    puVar8 = (undefined1 *)write(uVar4,__buf,(size_t)puVar10);
    if (puVar8 == puVar10) {
      apcStack_408[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_408[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_408[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_808[0] = (code *)0x131d90;
  puStack_430 = puVar10;
  puStack_428 = __n;
  puStack_420 = __s1;
  pvStack_418 = __buf;
  pvStack_410 = pvVar6;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  uVar5 = bson_bcon_magic();
  apcStack_808[0] = (code *)0x131daf;
  pcVar9 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_808[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_780,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,auStack_6b8)
  ;
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_808[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_808[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_808[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_808[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_808[0] = (code *)0x131ded;
    pvVar6 = (void *)bson_get_data(auStack_780);
    apcStack_808[0] = (code *)0x131df8;
    __buf = (void *)bson_get_data(pcVar9);
    if (*(uint *)(pcVar9 + 4) == uStack_77c) {
      apcStack_808[0] = (code *)0x131e0d;
      pvVar24 = (void *)bson_get_data(pcVar9);
      apcStack_808[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_780);
      apcStack_808[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar24,__s2,(ulong)*(uint *)(pcVar9 + 4));
      if (iVar2 == 0) {
        apcStack_808[0] = (code *)0x131e3c;
        bson_destroy(auStack_780);
        apcStack_808[0] = (code *)0x131e44;
        bson_destroy(pcVar9);
        return;
      }
    }
    __s1 = auStack_780;
    apcStack_808[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(__s1);
    apcStack_808[0] = (code *)0x131e72;
    uVar7 = bson_as_canonical_extended_json(pcVar9);
    uVar17 = 0xffffffff;
    if (uStack_77c != 0) {
      uVar20 = 0;
      do {
        if (*(int *)(pcVar9 + 4) == (int)uVar20) break;
        if (*(char *)((long)pvVar6 + uVar20) != *(char *)((long)__buf + uVar20)) {
          uVar17 = uVar20 & 0xffffffff;
          break;
        }
        uVar20 = uVar20 + 1;
      } while (uStack_77c != (uint)uVar20);
    }
    if ((int)uVar17 == -1) {
      uVar3 = uStack_77c;
      if (uStack_77c < *(uint *)(pcVar9 + 4)) {
        uVar3 = *(uint *)(pcVar9 + 4);
      }
      uVar17 = (ulong)(uVar3 - 1);
    }
    apcStack_808[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,uVar5,uVar7);
    apcStack_808[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_808[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_784 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_77c;
    apcStack_808[0] = (code *)0x131f2a;
    puVar10 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar10 != __n) goto LAB_00131f60;
    pcVar9 = (char *)(ulong)*(uint *)(pcVar9 + 4);
    apcStack_808[0] = (code *)0x131f40;
    pcVar11 = (char *)write(uVar4,__buf,(size_t)pcVar9);
    if (pcVar11 == pcVar9) {
      apcStack_808[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_808[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_b88 = (code *)0x131f98;
  pcStack_810 = pcVar9;
  apcStack_808[0] = (code *)apcStack_408;
  cVar1 = bson_init_from_json(auStack_b80,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_a98);
  if (cVar1 == '\0') {
    if (iStack_a98 != 1) goto LAB_00131fe4;
    if (iStack_a94 != 1) goto LAB_00131fe9;
    pcVar9 = acStack_a90;
    pcStack_b88 = (code *)0x131fcb;
    pcVar11 = strstr(pcVar9,"UESCAPE_TOOSHORT");
    if (pcVar11 != (char *)0x0) {
      pcStack_b88 = (code *)0x131fd8;
      bson_destroy(auStack_b80);
      return;
    }
  }
  else {
    pcStack_b88 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_b88 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_b88 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_b88 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_f88 = (code *)0x132029;
  pcStack_b90 = pcVar9;
  pcStack_b88 = (code *)apcStack_808;
  cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_e18);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_f88 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_f88 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_f88 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_f88 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') {
      pcStack_f88 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_f88 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_f88 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_f88 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_f88 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_f88 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_f88 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_f88 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_f88 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_f88 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_f80);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar9 = acStack_f00;
    pcStack_f88 = (code *)0x132084;
    bson_destroy(pcVar9);
    pcStack_f88 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_e18);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_f88 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_f88 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_f88 = (code *)0x1320e2;
    bson_iter_int32(auStack_f80);
  }
  pcStack_f88 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_f88 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_f88 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_f88 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_f88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_1388 = (code *)0x1322a4;
  pcStack_f98 = pcVar9;
  pvStack_f90 = __buf;
  pcStack_f88 = (code *)&pcStack_b88;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_1220);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_1388 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_1388 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_1388 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_1388 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_1388 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_1388 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_1388 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_1388 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_1388 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_1388 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_1388 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_1388 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_1388 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_1388 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_1388 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_1388 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_1388 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_1388 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_1388 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_1388 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_1388 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_1388 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_1388 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_1388 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_0013251a;
    __buf = (void *)0x7fffffffffffffff;
    pcStack_1388 = (code *)0x1322ee;
    lVar18 = bson_iter_int64(auStack_1380);
    if (lVar18 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar9 = acStack_1300;
    pcStack_1388 = (code *)0x132307;
    bson_destroy(pcVar9);
    pcStack_1388 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_1388 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_1388 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_1388 = (code *)0x132365;
    lVar18 = bson_iter_int64(auStack_1380);
    __buf = (void *)0x8000000000000000;
    if (lVar18 != -0x8000000000000000) goto LAB_0013255f;
    pcVar9 = acStack_1300;
    pcStack_1388 = (code *)0x132381;
    bson_destroy(pcVar9);
    pcStack_1388 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_1220 != 1) goto LAB_00132567;
    if (iStack_121c != 2) goto LAB_0013256c;
    pcVar9 = acStack_1218;
    pcStack_1388 = (code *)0x1323de;
    pcVar11 = strstr(pcVar9,"Number \"9223372036854775808\" is out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132571;
    pcStack_1388 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_1220 != 1) goto LAB_00132579;
    if (iStack_121c != 2) goto LAB_0013257e;
    pcStack_1388 = (code *)0x132441;
    pcVar11 = strstr(pcVar9,"Number \"-9223372036854775809\" is out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132583;
    pcStack_1388 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_1220 != 1) goto LAB_0013258b;
    if (iStack_121c != 2) goto LAB_00132590;
    pcStack_1388 = (code *)0x1324a4;
    pcVar11 = strstr(pcVar9,"Number \"10000000000000000000\" is out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132595;
    pcStack_1388 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_1220 != 1) goto LAB_0013259d;
    if (iStack_121c != 2) goto LAB_001325a2;
    pcStack_1388 = (code *)0x132503;
    pcVar11 = strstr(pcVar9,"Number \"-10000000000000000000\" is out of range");
    if (pcVar11 != (char *)0x0) {
      return;
    }
  }
  pcStack_1388 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1788 = (code *)0x1325e2;
  pcStack_1390 = pcVar9;
  pcStack_1388 = (code *)&pcStack_f88;
  cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1618);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_1788 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_1788 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_1788 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_1788 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_1788 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_1788 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_1788 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_1788 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_1788 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1788 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') {
      pcStack_1788 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_1788 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_1788 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_1788 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_1788 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_1788 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_1788 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_1788 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_1788 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_1788 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_1788 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_1788 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_1788 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_1780);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar9 = acStack_1700;
    pcStack_1788 = (code *)0x13263b;
    bson_destroy(pcVar9);
    pcStack_1788 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_1788 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_1788 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_1788 = (code *)0x132699;
    lVar18 = bson_iter_int64(auStack_1780);
    if (lVar18 != 0x100000000) goto LAB_001328a9;
    pcVar9 = acStack_1700;
    pcStack_1788 = (code *)0x1326bc;
    bson_destroy(pcVar9);
    pcStack_1788 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_1788 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_1788 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_1788 = (code *)0x13271a;
    dVar27 = (double)bson_iter_double(auStack_1780);
    if ((dVar27 != 1.0) || (NAN(dVar27))) goto LAB_001328be;
    pcVar9 = acStack_1700;
    pcStack_1788 = (code *)0x13273e;
    bson_destroy(pcVar9);
    pcStack_1788 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_1788 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_1788 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_1788 = (code *)0x13279c;
    dVar27 = (double)bson_iter_double(auStack_1780);
    if ((dVar27 != 0.0) || (NAN(dVar27))) goto LAB_001328d3;
    pcVar9 = acStack_1700;
    pcStack_1788 = (code *)0x1327c0;
    bson_destroy(pcVar9);
    pcStack_1788 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar9,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_1788 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_1788 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_1788 = (code *)0x132816;
    dVar27 = (double)bson_iter_double(auStack_1780);
    if ((dVar27 == 0.0) && (!NAN(dVar27))) {
      pcStack_1788 = (code *)0x132832;
      bson_iter_double(auStack_1780);
      if (extraout_XMM0_Db < 0) {
        pcStack_1788 = (code *)0x132849;
        bson_destroy(acStack_1700);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_1788 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar11 = "2e400";
  ppuVar25 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_17b0 = pcVar9;
  puStack_17a8 = __n;
  puStack_17a0 = __s1;
  pvStack_1798 = __buf;
  pvStack_1790 = pvVar6;
  pcStack_1788 = (code *)&pcStack_1388;
  while( true ) {
    pcStack_1b08 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar11);
    pcStack_1b08 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_1900,uVar5,0xffffffffffffffff,&iStack_1b00);
    if (cVar1 != '\0') break;
    if (iStack_1b00 != 1) goto LAB_00132a15;
    if (iStack_1afc != 2) goto LAB_00132a10;
    pcStack_1b08 = (code *)0x132979;
    pcVar9 = strstr(acStack_1af8,"out of range");
    if (pcVar9 == (char *)0x0) goto LAB_00132a1a;
    pcStack_1b08 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_1b08 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar11);
    pcStack_1b08 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_1900,uVar5,0xffffffffffffffff,&iStack_1b00);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_1b00 != 1) goto LAB_00132a29;
    if (iStack_1afc != 2) goto LAB_00132a24;
    pcStack_1b08 = (code *)0x1329da;
    pcVar9 = strstr(acStack_1af8,"out of range");
    if (pcVar9 == (char *)0x0) goto LAB_00132a2e;
    pcStack_1b08 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar11 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar11 == (char *)0x0) {
      return;
    }
  }
  pcStack_1b08 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_1b08 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_1b08 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_1b08 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_1b08 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_1b08 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_1b08 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_1b08 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1b20 = "out of range";
  pcVar21 = "{ \"d\": NaN }";
  ppuVar23 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar19 = aiStack_1e80;
  piVar12 = &iStack_1db8;
  piVar26 = (int *)0x14a6f6;
  pcVar9 = (char *)&dStack_1e88;
  uStack_1b30 = uVar5;
  puStack_1b28 = (undefined1 *)&iStack_1b00;
  pcStack_1b18 = pcVar11;
  ppuStack_1b10 = ppuVar25;
  pcStack_1b08 = (code *)&pcStack_1788;
  do {
    apcStack_1f08[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar19,pcVar21,0xffffffffffffffff,piVar12);
    if (cVar1 == '\0') {
      apcStack_1f08[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_1f08[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_1f08[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_1f08[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_1f08[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar19,"d",uVar5,1,pcVar9,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_1e88) && !NAN(dStack_1e88)) goto LAB_00132bfa;
    apcStack_1f08[0] = (code *)0x132ad4;
    bson_destroy(piVar19);
    pcVar21 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar21 != (char *)0x0);
  pcVar11 = "{ \"d\": NaNn }";
  ppuVar23 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar19 = aiStack_1db0;
  piVar12 = aiStack_1e80;
  piVar26 = &iStack_1db8;
  pcVar9 = "Got parse error at";
  do {
    apcStack_1f08[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar12,pcVar11,0xffffffffffffffff,piVar26);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_1db8 != 1) goto LAB_00132c16;
    if (iStack_1db4 != 1) goto LAB_00132c09;
    apcStack_1f08[0] = (code *)0x132b53;
    pcVar11 = strstr((char *)piVar19,"Got parse error at");
    if (pcVar11 == (char *)0x0) goto LAB_00132c0e;
    pcVar11 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar11 = "{ \"d\": nu";
  ppuVar23 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar19 = aiStack_1db0;
  piVar12 = aiStack_1e80;
  piVar26 = &iStack_1db8;
  pcVar9 = "Incomplete JSON";
  while( true ) {
    apcStack_1f08[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar12,pcVar11,0xffffffffffffffff,piVar26);
    if (cVar1 != '\0') break;
    if (iStack_1db8 != 1) goto LAB_00132c28;
    if (iStack_1db4 != 1) goto LAB_00132c1b;
    apcStack_1f08[0] = (code *)0x132bcf;
    pcVar11 = strstr((char *)piVar19,"Incomplete JSON");
    if (pcVar11 == (char *)0x0) goto LAB_00132c20;
    pcVar11 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar11 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_1f08[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_1f08[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_1f08[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_1f08[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_1f08[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_1f08[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_1f08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar11 = "{ \"d\": Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_1f30 = piVar19;
  pdStack_1f28 = (double *)pcVar9;
  ppuStack_1f20 = ppuVar23;
  piStack_1f18 = piVar12;
  piStack_1f10 = piVar26;
  apcStack_1f08[0] = (code *)&pcStack_1b08;
  do {
    apcStack_2308[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_2280,pcVar11,0xffffffffffffffff,&iStack_21b8);
    if (cVar1 == '\0') {
      apcStack_2308[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_2308[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_2308[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_2308[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_2308[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_2280,"d",uVar5,1,&dStack_2288,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_2288)) || (!NAN(dStack_2288 - dStack_2288) && !NAN(dStack_2288 - dStack_2288)))
    goto LAB_00132eb6;
    apcStack_2308[0] = (code *)0x132cd7;
    bson_destroy(aiStack_2280);
    pcVar11 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar9 = "{ \"d\": -Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_2308[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_2280,pcVar9,0xffffffffffffffff,&iStack_21b8);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_2308[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_2308[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_2280,"d",uVar5,1,&dStack_2288,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_2288)) || (!NAN(dStack_2288 - dStack_2288))) goto LAB_00132ec5;
    if (0.0 <= dStack_2288) goto LAB_00132eca;
    apcStack_2308[0] = (code *)0x132d88;
    bson_destroy(aiStack_2280);
    pcVar9 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar9 != (char *)0x0);
  pcVar11 = "{ \"d\": Infinityy }";
  ppuVar25 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar19 = aiStack_21b0;
  piVar12 = aiStack_2280;
  piVar26 = &iStack_21b8;
  pcVar9 = "Got parse error at";
  do {
    apcStack_2308[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar12,pcVar11,0xffffffffffffffff,piVar26);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_21b8 != 1) goto LAB_00132ee6;
    if (iStack_21b4 != 1) goto LAB_00132ed9;
    apcStack_2308[0] = (code *)0x132e0b;
    pcVar11 = strstr((char *)piVar19,"Got parse error at");
    if (pcVar11 == (char *)0x0) goto LAB_00132ede;
    pcVar11 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar11 = "{ \"d\": In";
  ppuVar25 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar19 = aiStack_21b0;
  piVar12 = aiStack_2280;
  piVar26 = &iStack_21b8;
  pcVar9 = "Incomplete JSON";
  while( true ) {
    apcStack_2308[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar12,pcVar11,0xffffffffffffffff,piVar26);
    if (cVar1 != '\0') break;
    if (iStack_21b8 != 1) goto LAB_00132ef8;
    if (iStack_21b4 != 1) goto LAB_00132eeb;
    apcStack_2308[0] = (code *)0x132e8b;
    pcVar11 = strstr((char *)piVar19,"Incomplete JSON");
    if (pcVar11 == (char *)0x0) goto LAB_00132ef0;
    pcVar11 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar11 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_2308[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_2308[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_2308[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_2308[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_2308[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_2308[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_2308[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2688 = (code *)0x132f2a;
  apcStack_2308[0] = (code *)apcStack_1f08;
  cVar1 = bson_init_from_json(auStack_2680,"{ \"x\": null }",0xffffffffffffffff,auStack_2590);
  if (cVar1 == '\0') {
    pcStack_2688 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2688 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_2688 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_2680,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2688 = (code *)0x132f5b;
      bson_destroy(auStack_2680);
      return;
    }
  }
  pcStack_2688 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2a88 = (code *)0x0;
  pcStack_2a90 = "}";
  acStack_2aa0[8] = -0x52;
  acStack_2aa0[9] = '/';
  acStack_2aa0[10] = '\x13';
  acStack_2aa0[0xb] = '\0';
  acStack_2aa0[0xc] = '\0';
  acStack_2aa0[0xd] = '\0';
  acStack_2aa0[0xe] = '\0';
  acStack_2aa0[0xf] = '\0';
  piStack_26b0 = piVar19;
  pdStack_26a8 = (double *)pcVar9;
  ppuStack_26a0 = ppuVar25;
  piStack_2698 = piVar12;
  piStack_2690 = piVar26;
  pcStack_2688 = (code *)apcStack_2308;
  uVar17 = bcon_new(0,"a","{","b","{");
  uStack_2990 = 0;
  uStack_2988 = 0;
  uStack_29a0 = 0;
  uStack_2998 = 0;
  uStack_29b0 = 0;
  uStack_29a8 = 0;
  uStack_29c0 = 0;
  uStack_29b8 = 0;
  uStack_29d0 = 0;
  uStack_29c8 = 0;
  uStack_29e0 = 0;
  uStack_29d8 = 0;
  uStack_29f0 = 0;
  uStack_29e8 = 0;
  uStack_2a00 = (undefined *)0x500000003;
  uStack_29f8 = 5;
  pcStack_2a88 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_2a00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2938);
  if (cVar1 != '\0') {
    pcStack_2a88 = (code *)0x133023;
    piVar26 = (int *)bson_get_data(&uStack_2a00);
    pcStack_2a88 = (code *)0x13302e;
    piVar12 = (int *)bson_get_data(uVar17);
    if (*(int *)(uVar17 + 4) == uStack_2a00._4_4_) {
      pcStack_2a88 = (code *)0x133043;
      pvVar6 = (void *)bson_get_data(uVar17);
      pcStack_2a88 = (code *)0x133053;
      pvVar24 = (void *)bson_get_data(&uStack_2a00);
      pcStack_2a88 = (code *)0x133061;
      iVar2 = bcmp(pvVar6,pvVar24,(ulong)*(uint *)(uVar17 + 4));
      if (iVar2 == 0) {
        pcStack_2a88 = (code *)0x133072;
        bson_destroy(&uStack_2a00);
        pcStack_2a88 = (code *)0x13307a;
        bson_destroy(uVar17);
        return;
      }
    }
    ppuVar25 = (undefined **)&uStack_2a00;
    pcStack_2a88 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar25);
    pcStack_2a88 = (code *)0x1330a8;
    uVar7 = bson_as_canonical_extended_json(uVar17);
    uVar20 = 0xffffffff;
    if (uStack_2a00._4_4_ != 0) {
      uVar22 = 0;
      do {
        if (*(int *)(uVar17 + 4) == (int)uVar22) break;
        if (*(char *)((long)piVar26 + uVar22) != *(char *)((long)piVar12 + uVar22)) {
          uVar20 = uVar22 & 0xffffffff;
          break;
        }
        uVar22 = uVar22 + 1;
      } while (uStack_2a00._4_4_ != (uint)uVar22);
    }
    if ((int)uVar20 == -1) {
      uVar3 = uStack_2a00._4_4_;
      if (uStack_2a00._4_4_ < *(uint *)(uVar17 + 4)) {
        uVar3 = *(uint *)(uVar17 + 4);
      }
      uVar20 = (ulong)(uVar3 - 1);
    }
    pcStack_2a88 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar5,uVar7);
    pcStack_2a88 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar9 = (char *)(ulong)uVar3;
    pcStack_2a88 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2a04 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_2a88 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_2a88 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_2a88 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar25 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar9 = (char *)((ulong)uStack_2a00 >> 0x20);
      pcStack_2a88 = (code *)0x133160;
      pdVar13 = (double *)write(uVar3,piVar26,(size_t)pcVar9);
      if (pdVar13 != (double *)pcVar9) goto LAB_00133191;
      uVar17 = (ulong)*(uint *)(uVar17 + 4);
      pcStack_2a88 = (code *)0x133176;
      uVar20 = write(uVar4,piVar12,uVar17);
      if (uVar20 == uVar17) {
        pcStack_2a88 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_2a88 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2a88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar11 = acStack_2aa0;
  acStack_2aa0[8] = '\0';
  acStack_2aa0[9] = '\0';
  acStack_2aa0[10] = '\0';
  acStack_2aa0[0xb] = '\0';
  acStack_2aa0[0xc] = '\0';
  acStack_2aa0[0xd] = '\0';
  acStack_2aa0[0xe] = '@';
  acStack_2aa0[0xf] = '0';
  acStack_2aa0[0] = '\v';
  acStack_2aa0[1] = '\0';
  acStack_2aa0[2] = '\0';
  acStack_2aa0[3] = '\0';
  acStack_2aa0[4] = '\0';
  acStack_2aa0[5] = '\0';
  acStack_2aa0[6] = '\0';
  acStack_2aa0[7] = '\0';
  pcStack_2ab0 = (code *)0x1331ce;
  pcStack_2a90 = (char *)uVar17;
  pcStack_2a88 = (code *)piVar12;
  plVar14 = (long *)bson_new();
  pcStack_2ab0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar14,"decimal128",0xffffffff,pcVar11);
  if (cVar1 == '\0') {
    pcStack_2ab0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_2ab0 = (code *)0x1331f7;
    pcVar11 = (char *)bson_as_json(plVar14,auStack_2aa8);
    if (pcVar11 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_2ab0 = (code *)0x133221;
      bson_free(pcVar11);
      pcStack_2ab0 = (code *)0x133229;
      bson_destroy(plVar14);
      return;
    }
    pcStack_2ab0 = (code *)0x133215;
    iVar2 = strcmp(pcVar11,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_2ab0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar28 = &pcStack_2ab0;
  pcStack_2f08 = (code *)0x133271;
  plStack_2ab8 = plVar14;
  pcStack_2ab0 = (code *)&pcStack_2688;
  cVar1 = bson_init_from_json(auStack_2e00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_2d18);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_2f08 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_2e80,auStack_2e00);
  if (cVar1 == '\0') {
    pcStack_2f08 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_2f08 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_2f08 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_2f08 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_2f08 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_2e80,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_2f08 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_2e80);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar14 = &lStack_2e90;
    pcStack_2f08 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_2e80,plVar14);
    if (lStack_2e90 != 0xb) goto LAB_0013330b;
    if (lStack_2e88 == 0x3040000000000000) {
      pcStack_2f08 = (code *)0x1332f5;
      bson_destroy(auStack_2e00);
      return;
    }
  }
  pcStack_2f08 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_2f08 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar21 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar23 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_2f20 = plVar14;
  pdStack_2f18 = (double *)pcVar9;
  pcStack_2f10 = pcVar11;
  pcStack_2f08 = (code *)piVar26;
  do {
    pcStack_3130 = (code *)0x133357;
    lVar18 = bson_new_from_json(pcVar21,0xffffffffffffffff,&iStack_3120);
    if (lVar18 != 0) {
      pcStack_3130 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_3130 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_3118,
              piVar26);
      pcStack_3130 = (code *)0x1333c7;
      abort();
    }
    if (iStack_3120 != 1) {
LAB_001333cc:
      pcStack_3130 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_3348 = (code *)0x1333f1;
      pcStack_3138 = acStack_3118;
      pcStack_3130 = (code *)&iStack_3120;
      pcVar9 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_3338);
      pcStack_3348 = (code *)0x1333fe;
      pcVar11 = (char *)bson_as_json(pcVar9,0);
      if (pcVar11 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_3348 = (code *)0x133428;
        bson_free(pcVar11);
        pcStack_3348 = (code *)0x133430;
        bson_destroy(pcVar9);
        return;
      }
      pcStack_3348 = (code *)0x13341c;
      iVar2 = strcmp(pcVar11,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_3348 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3558 = 0x2200223a2261227b;
      uStack_3550 = 0x7d;
      uStack_355c = 0x227b;
      pcStack_3348 = (code *)pcVar9;
      lVar18 = bson_new_from_json(&uStack_3558,9,&iStack_3548);
      if (lVar18 == 0) {
        if (iStack_3548 != 1) goto LAB_001334fc;
        if (iStack_3544 != 1) goto LAB_00133501;
        pcVar9 = acStack_3540;
        pcVar21 = strstr(pcVar9,"Got parse error");
        if (pcVar21 == (char *)0x0) goto LAB_00133506;
        lVar18 = bson_new_from_json(&uStack_355c,3,&iStack_3548);
        if (lVar18 != 0) goto LAB_001334f7;
        if (iStack_3548 != 1) goto LAB_0013350e;
        if (iStack_3544 == 1) {
          pcVar21 = strstr(pcVar9,"Got parse error");
          if (pcVar21 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar7 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar7,0xf,1,0,uVar5,pcVar9,ppuVar23,ppuVar25,pcVar11,piVar26,ppcVar28);
      uVar15 = bcon_new(0,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar15,0);
      uVar5 = bson_new();
      uVar15 = bson_new();
      uVar16 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar15,uVar16,0);
      uVar5 = bcon_new(0,"a",uVar7,0xf,1,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar7,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_311c != 2) {
      pcStack_3130 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar26 = (int *)ppuVar23[-1];
    pcStack_3130 = (code *)0x13337e;
    pcVar9 = strstr(acStack_3118,(char *)piVar26);
    if (pcVar9 == (char *)0x0) goto LAB_001333a4;
    pcVar21 = *ppuVar23;
    ppuVar23 = ppuVar23 + 2;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_1f08[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_2308[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_2308[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_2308[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar12 = &iStack_21b8;
  pcVar9 = (char *)&dStack_2288;
  piVar19 = aiStack_2280;
  piVar26 = (int *)0x14a6f6;
  apcStack_2308[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_2308[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_uescape (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   const char *euro = "{ \"euro\": \"\\u20AC\"}";
   bson_t *bson_euro = BCON_NEW ("euro", BCON_UTF8 ("\xE2\x82\xAC"));

   const char *crlf = "{ \"crlf\": \"\\r\\n\"}";
   bson_t *bson_crlf = BCON_NEW ("crlf", BCON_UTF8 ("\r\n"));

   const char *quote = "{ \"quote\": \"\\\"\"}";
   bson_t *bson_quote = BCON_NEW ("quote", BCON_UTF8 ("\""));

   const char *backslash = "{ \"backslash\": \"\\\\\"}";
   bson_t *bson_backslash = BCON_NEW ("backslash", BCON_UTF8 ("\\"));

   const char *empty = "{ \"\": \"\"}";
   bson_t *bson_empty = BCON_NEW ("", BCON_UTF8 (""));

   const char *escapes = "{ \"escapes\": \"\\f\\b\\t\"}";
   bson_t *bson_escapes = BCON_NEW ("escapes", BCON_UTF8 ("\f\b\t"));

   const char *nil_byte = "{ \"nil\": \"\\u0000\"}";
   bson_t *bson_nil_byte = bson_new (); /* we'll append "\0" to it, below */

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } uencode_test_t;

   uencode_test_t tests[] = {
      {euro, bson_euro},
      {crlf, bson_crlf},
      {quote, bson_quote},
      {backslash, bson_backslash},
      {empty, bson_empty},
      {escapes, bson_escapes},
      {nil_byte, bson_nil_byte},
   };

   int n_tests = sizeof (tests) / sizeof (uencode_test_t);
   int i;

   bson_append_utf8 (bson_nil_byte, "nil", -1, "\0", 1);

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);

      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}